

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

char * __thiscall
glcts::GeometryShaderRendering::getTestName
          (GeometryShaderRendering *this,_shader_input input,_shader_output_type output_type,
          GLenum drawcall_mode)

{
  ulong uVar1;
  TestError *this_00;
  undefined *puVar2;
  
  switch(input) {
  case SHADER_INPUT_POINTS:
    if (output_type < SHADER_OUTPUT_TYPE_COUNT) {
      uVar1 = (ulong)output_type;
      puVar2 = &DAT_017a06d0;
LAB_00cf8e7d:
      return puVar2 + *(int *)(puVar2 + uVar1 * 4);
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader output type requested",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x56);
    break;
  case SHADER_INPUT_LINES:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if (drawcall_mode - 1 < 3) {
        uVar1 = (ulong)(drawcall_mode - 1);
        puVar2 = &DAT_017a06e8;
        goto LAB_00cf8e7d;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"UNrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x88);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
      if (drawcall_mode - 1 < 3) {
        uVar1 = (ulong)(drawcall_mode - 1);
        puVar2 = &DAT_017a06f4;
        goto LAB_00cf8e7d;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"UNrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x9f);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if (drawcall_mode - 1 < 3) {
        uVar1 = (ulong)(drawcall_mode - 1);
        puVar2 = &DAT_017a06dc;
        goto LAB_00cf8e7d;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"UNrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x71);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader output type requested",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xa8);
    }
    break;
  case SHADER_INPUT_LINES_WITH_ADJACENCY:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if (drawcall_mode == 10) {
        return "lines_with_adjacency_input_points_output_lines_adjacency_drawcall";
      }
      if (drawcall_mode == 0xb) {
        return "lines_with_adjacency_input_points_output_line_strip_drawcall";
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xd1);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
      if (drawcall_mode == 10) {
        return "lines_with_adjacency_input_triangle_strip_output_lines_adjacency_drawcall";
      }
      if (drawcall_mode == 0xb) {
        return "lines_with_adjacency_input_triangle_strip_output_line_strip_drawcall";
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xe3);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if (drawcall_mode == 10) {
        return "lines_with_adjacency_input_line_strip_output_lines_adjacency_drawcall";
      }
      if (drawcall_mode == 0xb) {
        return "lines_with_adjacency_input_line_strip_output_line_strip_drawcall";
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xbf);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader output type requested",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xeb);
    }
    break;
  case SHADER_INPUT_TRIANGLES:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if (drawcall_mode - 4 < 3) {
        uVar1 = (ulong)(drawcall_mode - 4);
        puVar2 = &DAT_017a070c;
        goto LAB_00cf8e7d;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x11d);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
      if (drawcall_mode - 4 < 3) {
        uVar1 = (ulong)(drawcall_mode - 4);
        puVar2 = &DAT_017a0718;
        goto LAB_00cf8e7d;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x134);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if (drawcall_mode - 4 < 3) {
        uVar1 = (ulong)(drawcall_mode - 4);
        puVar2 = &DAT_017a0700;
        goto LAB_00cf8e7d;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x106);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader output type requested",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x13d);
    }
    break;
  case SHADER_INPUT_TRIANGLES_WITH_ADJACENCY:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if (drawcall_mode == 0xc) {
        return "triangles_with_adjacency_input_points_output_triangles_adjacency_drawcall";
      }
      if (drawcall_mode == 0xd) {
        return "triangles_with_adjacency_input_points_output_triangle_strip_adjacency_drawcall";
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x169);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
      if (drawcall_mode == 0xc) {
        return "triangles_with_adjacency_input_triangle_strip_output_triangles_adjacency_drawcall";
      }
      if (drawcall_mode == 0xd) {
        return 
        "triangles_with_adjacency_input_triangle_strip_output_triangle_strip_adjacency_drawcall";
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x17c);
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if (drawcall_mode == 0xc) {
        return "triangles_with_adjacency_input_line_strip_output_triangles_adjacency_drawcall";
      }
      if (drawcall_mode == 0xd) {
        return "triangles_with_adjacency_input_line_strip_output_triangle_strip_adjacency_drawcall";
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized draw call mode",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x155);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader output type requested",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x184);
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized layout qualifier",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x18e);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const char* GeometryShaderRendering::getTestName(_shader_input input, _shader_output_type output_type,
												 glw::GLenum drawcall_mode)
{
	const char* result = NULL;

	switch (input)
	{
	case SHADER_INPUT_POINTS:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
			result = "points_input_line_strip_output";
			break;
		case SHADER_OUTPUT_TYPE_POINTS:
			result = "points_input_points_output";
			break;
		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
			result = "points_input_triangles_output";
			break;

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	}

	case SHADER_INPUT_LINES:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_LINES:
				result = "lines_input_line_strip_output_lines_drawcall";
				break;
			case GL_LINE_STRIP:
				result = "lines_input_line_strip_output_line_strip_drawcall";
				break;
			case GL_LINE_LOOP:
				result = "lines_input_line_strip_output_line_loop_drawcall";
				break;

			default:
			{
				TCU_FAIL("UNrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			switch (drawcall_mode)
			{
			case GL_LINES:
				result = "lines_input_points_output_lines_drawcall";
				break;
			case GL_LINE_STRIP:
				result = "lines_input_points_output_line_strip_drawcall";
				break;
			case GL_LINE_LOOP:
				result = "lines_input_points_output_line_loop_drawcall";
				break;

			default:
			{
				TCU_FAIL("UNrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS: */

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_LINES:
				result = "lines_input_triangle_strip_output_lines_drawcall";
				break;
			case GL_LINE_STRIP:
				result = "lines_input_triangle_strip_output_line_strip_drawcall";
				break;
			case GL_LINE_LOOP:
				result = "lines_input_triangle_strip_output_line_loop_drawcall";
				break;

			default:
			{
				TCU_FAIL("UNrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_LINES:*/

	case SHADER_INPUT_LINES_WITH_ADJACENCY:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			if ((drawcall_mode == GL_LINES_ADJACENCY_EXT) || (drawcall_mode == GL_LINES_ADJACENCY))
			{
				result = "lines_with_adjacency_input_line_strip_output_lines_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT) || (drawcall_mode == GL_LINE_STRIP_ADJACENCY))
			{
				result = "lines_with_adjacency_input_line_strip_output_line_strip_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			if ((drawcall_mode == GL_LINES_ADJACENCY_EXT) || (drawcall_mode == GL_LINES_ADJACENCY))
			{
				result = "lines_with_adjacency_input_points_output_lines_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT) || (drawcall_mode == GL_LINE_STRIP_ADJACENCY))
			{
				result = "lines_with_adjacency_input_points_output_line_strip_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS: */

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			if ((drawcall_mode == GL_LINES_ADJACENCY_EXT) || (drawcall_mode == GL_LINES_ADJACENCY))
			{
				result = "lines_with_adjacency_input_triangle_strip_output_lines_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT) || (drawcall_mode == GL_LINE_STRIP_ADJACENCY))
			{
				result = "lines_with_adjacency_input_triangle_strip_output_line_strip_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_LINES_WITH_ADJACENCY: */

	case SHADER_INPUT_TRIANGLES:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_TRIANGLES:
				result = "triangles_input_line_strip_output_triangles_drawcall";
				break;
			case GL_TRIANGLE_FAN:
				result = "triangles_input_line_strip_output_triangle_fan_drawcall";
				break;
			case GL_TRIANGLE_STRIP:
				result = "triangles_input_line_strip_output_triangle_strip_drawcall";
				break;

			default:
			{
				TCU_FAIL("Unrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			switch (drawcall_mode)
			{
			case GL_TRIANGLES:
				result = "triangles_input_points_output_triangles_drawcall";
				break;
			case GL_TRIANGLE_FAN:
				result = "triangles_input_points_output_triangle_fan_drawcall";
				break;
			case GL_TRIANGLE_STRIP:
				result = "triangles_input_points_output_triangle_strip_drawcall";
				break;

			default:
			{
				TCU_FAIL("Unrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS: */

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_TRIANGLES:
				result = "triangles_input_triangle_strip_output_triangles_drawcall";
				break;
			case GL_TRIANGLE_FAN:
				result = "triangles_input_triangle_strip_output_triangle_fan_drawcall";
				break;
			case GL_TRIANGLE_STRIP:
				result = "triangles_input_triangle_strip_output_triangle_strip_drawcall";
				break;

			default:
			{
				TCU_FAIL("Unrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_TRIANGLES: */

	case SHADER_INPUT_TRIANGLES_WITH_ADJACENCY:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			if ((drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT) || (drawcall_mode == GL_TRIANGLES_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_line_strip_output_triangles_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT) ||
					 (drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_line_strip_output_triangle_strip_adjacency_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			if ((drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT) || (drawcall_mode == GL_TRIANGLES_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_points_output_triangles_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT) ||
					 (drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_points_output_triangle_strip_adjacency_drawcall";
				break;
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS:*/

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			if ((drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT) || (drawcall_mode == GL_TRIANGLES_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_triangle_strip_output_triangles_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT) ||
					 (drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_triangle_strip_output_triangle_strip_adjacency_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_TRIANGLES_WITH_ADJACENCY: */

	default:
	{
		/* Unrecognized geometry shader input layout qualifier */
		TCU_FAIL("Unrecognized layout qualifier");
	}
	} /* switch (input) */

	return result;
}